

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O2

void __thiscall
ut11::Mock<void(std::exception)>::Verify<ut11::Operands::IsAny<std::exception>>
          (Mock<void(std::exception)> *this,size_t line,string *file,
          IsAny<std::exception> *expectations)

{
  size_t sVar1;
  string sStack_58;
  string local_38;
  
  sVar1 = detail::MockArgumentHandler<std::exception>::
          CountCalls<ut11::Operands::IsAny<std::exception>>
                    ((MockArgumentHandler<std::exception> *)(this + 0x20));
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&local_38,(string *)file);
    GetVerifyFailMessage_abi_cxx11_(&sStack_58,this);
    Assert::Fail(line,&local_38,&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void Verify(std::size_t line, std::string file, const Expectations&... expectations) const
		{
			if ( m_argumentHandler.CountCalls(expectations...) == 0 )
				Assert::Fail(line, file, GetVerifyFailMessage());
		}